

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O0

void pzgeom::TPZQuadraticQuad::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double eta;
  double qsi;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  TPZFMatrix<double> *in_stack_ffffffffffffff40;
  
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  *pdVar3 = (dVar2 + -1.0) * -0.25 * (dVar1 + -1.0) * (dVar2 + 1.0 + dVar1);
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  *pdVar3 = (dVar2 + -1.0) * 0.25 * ((dVar2 + 1.0) - dVar1) * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  *pdVar3 = (dVar1 + 1.0) * 0.25 * (dVar2 + 1.0) * ((dVar1 + dVar2) - 1.0);
  col = (dVar2 + 1.0) * -0.25 * ((dVar2 + -1.0) - dVar1) * (dVar1 + -1.0);
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int64_t)col);
  *pdVar3 = col;
  row = (dVar2 + -1.0) * 0.5 * (dVar1 + -1.0) * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff40,(int64_t)row,(int64_t)col);
  *pdVar3 = row;
  this = (TPZFMatrix<double> *)((dVar2 + -1.0) * -0.5 * (dVar2 + 1.0) * (dVar1 + 1.0));
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (double)this;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + 1.0) * -0.5 * (dVar1 + -1.0) * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * 0.5 * (dVar2 + 1.0) * (dVar1 + -1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * -0.25 * (dVar1 + dVar1 + dVar2);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar1 + -1.0) * -0.25 * (dVar2 + dVar2 + dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * 0.25 * (dVar2 - (dVar1 + dVar1));
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + dVar2 + -dVar1) * 0.25 * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + 1.0) * 0.25 * (dVar1 + dVar1 + dVar2);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar1 + 1.0) * 0.25 * (dVar2 + dVar2 + dVar1);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + 1.0) * -0.25 * (dVar2 - (dVar1 + dVar1));
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + dVar2 + -dVar1) * -0.25 * (dVar1 + -1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * dVar1;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar1 + -1.0) * 0.5 * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * -0.5 * (dVar2 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = -dVar2 * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = -(dVar2 + 1.0) * dVar1;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar1 + -1.0) * -0.5 * (dVar1 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar2 + -1.0) * 0.5 * (dVar2 + 1.0);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar2 * (dVar1 + -1.0);
  return;
}

Assistant:

void TPZQuadraticQuad::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
	T qsi = par[0], eta = par[1];
	
	phi(0,0)  = -0.25*(-1. + eta)*(-1. + qsi)*(1. + eta + qsi);
	phi(1,0)  =  0.25*(-1. + eta)*(1. + eta - qsi)*(1. + qsi);
	phi(2,0)  =  0.25*( 1. + qsi)*(1. + eta)*(qsi + eta - 1.);
	phi(3,0)  = -0.25*( 1. + eta)*(-1. + eta - qsi)*(-1. + qsi);
	
	phi(4,0)  =  0.5*(-1. + eta)*(-1. + qsi)*( 1. + qsi);
	phi(5,0)  = -0.5*(-1. + eta)*( 1. + eta)*( 1. + qsi);
	phi(6,0)  = -0.5*( 1. + eta)*(-1. + qsi)*( 1. + qsi);
	phi(7,0)  =  0.5*(-1. + eta)*( 1. + eta)*(-1. + qsi);
	
	dphi(0,0) = -0.25*(-1. + eta)*(eta + 2.*qsi);
	dphi(1,0) = -0.25*(-1. + qsi)*(2.*eta + qsi);
	dphi(0,1) =  0.25*(-1. + eta)*(eta - 2.*qsi);
	dphi(1,1) =  0.25*(2.*eta - qsi)*(1. + qsi);
	dphi(0,2) =  0.25*(1. + eta)*(eta + 2.*qsi);
	dphi(1,2) =  0.25*(1. + qsi)*(2.*eta + qsi);
	dphi(0,3) = -0.25*(1. + eta)*(eta - 2.*qsi);
	dphi(1,3) = -0.25*(2.*eta - qsi)*(-1. + qsi);
	
	dphi(0,4) =  (-1. + eta)*qsi;
	dphi(1,4) =  0.5*(-1. + qsi)*(1. + qsi);
	dphi(0,5) = -0.5*(-1. + eta)*(1. + eta);
	dphi(1,5) = -eta*(1. + qsi);
	dphi(0,6) = -(1. + eta)*qsi;
	dphi(1,6) = -0.5*(-1. + qsi)*(1. + qsi);
	dphi(0,7) =  0.5*(-1. + eta)*(1. + eta);
	dphi(1,7) =  eta*(-1. + qsi);
}